

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O2

bool __thiscall
glcts::anon_unknown_0::VertexAttribBindingBase::CheckFB
          (VertexAttribBindingBase *this,Vec3 *expected)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint height;
  undefined4 extraout_var;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  float fVar8;
  allocator_type local_5d;
  int local_5c;
  int local_58;
  Vec3 g_color_max;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fb;
  
  iVar2 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext
            [4])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  local_58 = 1 << (*(byte *)(lVar5 + 8) & 0x1f);
  local_5c = 1 << (*(byte *)(lVar5 + 0xc) & 0x1f);
  bVar1 = *(byte *)(lVar5 + 0x10);
  tcu::Vector<float,_3>::Vector(&g_color_max,255.0);
  iVar2 = getWindowWidth(this);
  iVar3 = getWindowHeight(this);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&fb,(long)(iVar3 * iVar2 * 4),&local_5d);
  iVar2 = getWindowWidth(this);
  height = getWindowHeight(this);
  iVar3 = 0;
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0,0,iVar2,height,0x1908
             ,0x1401,fb.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  uVar4 = 0;
  if (0 < (int)height) {
    uVar4 = height;
  }
  uVar7 = 0;
  do {
    if (uVar7 == uVar4) {
LAB_00c12e5a:
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&fb.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      return (int)height <= (int)uVar7;
    }
    for (uVar6 = 0; iVar2 != (int)uVar6; uVar6 = (ulong)((int)uVar6 + 1)) {
      if (1.0 / (float)local_58 <
          ABS((float)fb.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar3] / g_color_max.m_data[0] -
              expected->m_data[0])) {
        fVar8 = expected->m_data[2];
        lVar5 = (long)(iVar3 + 1);
LAB_00c12e0f:
        anon_unknown_0::Output
                  ("Incorrect framebuffer color at pixel (%d %d). Color is (%f %f %f). Color should be (%f %f %f).\n"
                   ,(double)((float)fb.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start[iVar3] /
                            g_color_max.m_data[0]),
                   (double)((float)fb.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start[lVar5] /
                           g_color_max.m_data[1]),
                   (double)((float)fb.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start[iVar3 + 2] /
                           g_color_max.m_data[2]),(double)expected->m_data[0],
                   (double)expected->m_data[1],(double)fVar8,uVar6,(ulong)uVar7);
        goto LAB_00c12e5a;
      }
      lVar5 = (long)(iVar3 + 1);
      fVar8 = expected->m_data[2];
      if ((1.0 / (float)local_5c <
           ABS((float)fb.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar5] / g_color_max.m_data[1] -
               expected->m_data[1])) ||
         (1.0 / (float)(1 << (bVar1 & 0x1f)) <
          ABS((float)fb.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar3 + 2] / g_color_max.m_data[2] - fVar8)))
      goto LAB_00c12e0f;
      iVar3 = iVar3 + 4;
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

bool CheckFB(Vec3 expected)
	{
		const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
		const tcu::PixelFormat&  pixelFormat  = renderTarget.getPixelFormat();
		Vec3					 g_color_eps  = Vec3(1.f / static_cast<float>(1 << pixelFormat.redBits),
								1.f / static_cast<float>(1 << pixelFormat.greenBits),
								1.f / static_cast<float>(1 << pixelFormat.blueBits));
		Vec3				 g_color_max = Vec3(255);
		std::vector<GLubyte> fb(getWindowWidth() * getWindowHeight() * 4);
		int					 fb_w = getWindowWidth();
		int					 fb_h = getWindowHeight();
		glReadPixels(0, 0, fb_w, fb_h, GL_RGBA, GL_UNSIGNED_BYTE, &fb[0]);
		for (GLint i = 0, y = 0; y < fb_h; ++y)
			for (GLint x = 0; x < fb_w; ++x, i += 4)
			{
				if (fabs(fb[i + 0] / g_color_max[0] - expected[0]) > g_color_eps[0] ||
					fabs(fb[i + 1] / g_color_max[1] - expected[1]) > g_color_eps[1] ||
					fabs(fb[i + 2] / g_color_max[2] - expected[2]) > g_color_eps[2])
				{

					Output("Incorrect framebuffer color at pixel (%d %d). Color is (%f %f %f). "
						   "Color should be (%f %f %f).\n",
						   x, y, fb[i + 0] / g_color_max[0], fb[i + 1] / g_color_max[1], fb[i + 2] / g_color_max[2],
						   expected[0], expected[1], expected[2]);
					return false;
				}
			}
		return true;
	}